

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_TestShell *this)

{
  TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *this_00;
  TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_TestShell *this_local;
  
  this_00 = (TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                         ,0xc4);
  TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test::
  TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakOutsideCheckingPeriod)
{
    detector->stopChecking();
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    SimpleString output = detector->report(mem_leak_period_all);
    CHECK(output.contains("Memory leak(s) found"));
    CHECK(output.contains("size: 4"));
    CHECK(output.contains("new"));
    CHECK(output.contains("Total number of leaks"));
    PlatformSpecificFree(mem);
}